

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::BilinearIntersection::ToString_abi_cxx11_(BilinearIntersection *this)

{
  string *in_RDI;
  Point2<float> *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::Point2<float>const&,float_const&>
            (in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string BilinearIntersection::ToString() const {
    return StringPrintf("[ BilinearIntersection uv: %s t: %f", uv, t);
}